

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

pair<slang::ast::Compilation::DefinitionLookupResult,_bool> * __thiscall
slang::ast::Compilation::resolveConfigRules
          (pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *__return_storage_ptr__,
          Compilation *this,string_view lookupName,Scope *scope,ResolvedConfig *parentConfig,
          ConfigRule *rule,
          vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *defList)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  uint64_t uVar5;
  ulong uVar6;
  ConfigRule *rule_00;
  DefinitionSymbol *pDVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  pointer ppSVar11;
  ulong uVar12;
  size_t sVar13;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  CellOverride *cellOverride;
  optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> result;
  anon_class_40_5_c3c3317d findDefWithOverride;
  CellOverride *local_e8;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  _Storage<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>,_true> local_a8;
  char local_88;
  anon_class_40_5_c3c3317d local_80;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  rule_00 = rule;
  local_b8._M_str = lookupName._M_str;
  local_b8._M_len = lookupName._M_len;
  local_e8 = (CellOverride *)0x0;
  if (parentConfig == (ResolvedConfig *)0x0) {
    ppSVar11 = (pointer)0x0;
    sVar13 = 0;
  }
  else {
    ppSVar11 = (parentConfig->liblist)._M_ptr;
    sVar13 = (parentConfig->liblist)._M_extent._M_extent_value;
    this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              ConfigBlockSymbol::getCellOverrides(parentConfig->useConfig);
    uVar5 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                      (this_00,&local_b8);
    uVar9 = uVar5 >> ((byte)*this_00 & 0x3f);
    lVar10 = (uVar5 & 0xff) * 4;
    cVar15 = (&UNK_0049e39c)[lVar10];
    cVar16 = (&UNK_0049e39d)[lVar10];
    cVar17 = (&UNK_0049e39e)[lVar10];
    bVar18 = (&UNK_0049e39f)[lVar10];
    uVar6 = (ulong)((uint)uVar5 & 7);
    uVar12 = 0;
    cVar19 = cVar15;
    cVar20 = cVar16;
    cVar21 = cVar17;
    bVar22 = bVar18;
    cVar23 = cVar15;
    cVar24 = cVar16;
    cVar25 = cVar17;
    bVar26 = bVar18;
    cVar27 = cVar15;
    cVar28 = cVar16;
    cVar29 = cVar17;
    bVar30 = bVar18;
    do {
      pcVar1 = (char *)(*(long *)(this_00 + 0x10) + uVar9 * 0x10);
      local_48 = *pcVar1;
      cStack_47 = pcVar1[1];
      cStack_46 = pcVar1[2];
      bStack_45 = pcVar1[3];
      cStack_44 = pcVar1[4];
      cStack_43 = pcVar1[5];
      cStack_42 = pcVar1[6];
      bStack_41 = pcVar1[7];
      cStack_40 = pcVar1[8];
      cStack_3f = pcVar1[9];
      cStack_3e = pcVar1[10];
      bStack_3d = pcVar1[0xb];
      cStack_3c = pcVar1[0xc];
      cStack_3b = pcVar1[0xd];
      cStack_3a = pcVar1[0xe];
      bVar8 = pcVar1[0xf];
      auVar14[0] = -(local_48 == cVar15);
      auVar14[1] = -(cStack_47 == cVar16);
      auVar14[2] = -(cStack_46 == cVar17);
      auVar14[3] = -(bStack_45 == bVar18);
      auVar14[4] = -(cStack_44 == cVar19);
      auVar14[5] = -(cStack_43 == cVar20);
      auVar14[6] = -(cStack_42 == cVar21);
      auVar14[7] = -(bStack_41 == bVar22);
      auVar14[8] = -(cStack_40 == cVar23);
      auVar14[9] = -(cStack_3f == cVar24);
      auVar14[10] = -(cStack_3e == cVar25);
      auVar14[0xb] = -(bStack_3d == bVar26);
      auVar14[0xc] = -(cStack_3c == cVar27);
      auVar14[0xd] = -(cStack_3b == cVar28);
      auVar14[0xe] = -(cStack_3a == cVar29);
      auVar14[0xf] = -(bVar8 == bVar30);
      uVar4 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      bStack_39 = bVar8;
      if (uVar4 != 0) {
        local_d8 = *(long *)(this_00 + 0x10) + uVar9 * 0x10;
        lVar10 = *(long *)(this_00 + 0x18);
        local_e0 = uVar6;
        local_d0 = uVar12;
        local_c8 = uVar9;
        local_58 = cVar15;
        cStack_57 = cVar16;
        cStack_56 = cVar17;
        bStack_55 = bVar18;
        cStack_54 = cVar19;
        cStack_53 = cVar20;
        cStack_52 = cVar21;
        bStack_51 = bVar22;
        cStack_50 = cVar23;
        cStack_4f = cVar24;
        cStack_4e = cVar25;
        bStack_4d = bVar26;
        cStack_4c = cVar27;
        cStack_4b = cVar28;
        cStack_4a = cVar29;
        bStack_49 = bVar30;
        do {
          local_c0 = (ulong)uVar4;
          uVar2 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          __y = (basic_string_view<char,_std::char_traits<char>_> *)
                ((ulong)uVar2 * 0x48 + lVar10 + uVar9 * 0x438);
          bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             this_00,&local_b8,__y);
          if (bVar3) {
            local_e8 = (CellOverride *)(__y + 1);
            rule_00 = (ConfigRule *)__y[4]._M_len;
            rule = rule_00;
            goto LAB_00380a7b;
          }
          uVar4 = (uint)local_c0 - 1 & (uint)local_c0;
        } while (uVar4 != 0);
        bVar8 = *(byte *)(local_d8 + 0xf);
        uVar6 = local_e0;
        uVar9 = local_c8;
        uVar12 = local_d0;
        cVar15 = local_58;
        cVar16 = cStack_57;
        cVar17 = cStack_56;
        bVar18 = bStack_55;
        cVar19 = cStack_54;
        cVar20 = cStack_53;
        cVar21 = cStack_52;
        bVar22 = bStack_51;
        cVar23 = cStack_50;
        cVar24 = cStack_4f;
        cVar25 = cStack_4e;
        bVar26 = bStack_4d;
        cVar27 = cStack_4c;
        cVar28 = cStack_4b;
        cVar29 = cStack_4a;
        bVar30 = bStack_49;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar6] & bVar8) == 0) break;
      lVar10 = uVar9 + uVar12;
      uVar12 = uVar12 + 1;
      uVar9 = lVar10 + 1U & *(ulong *)(this_00 + 8);
    } while (uVar12 <= *(ulong *)(this_00 + 8));
  }
LAB_00380a7b:
  if (rule_00 != (ConfigRule *)0x0) {
    if ((rule_00->useCell).name._M_len != 0) {
      resolveConfigRule(__return_storage_ptr__,this,scope,rule_00);
      return __return_storage_ptr__;
    }
    rule_00->isUsed = true;
    if ((rule_00->liblist).
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_engaged == true) {
      ppSVar11 = (rule_00->liblist).
                 super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                 ._M_payload._M_value._M_ptr;
      sVar13 = *(size_t *)
                ((long)&(rule_00->liblist).
                        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                        ._M_payload + 8);
    }
  }
  local_80.cellOverride = &local_e8;
  local_80.defList = defList;
  local_80.rule = &rule;
  local_80.this = this;
  local_80.scope = scope;
  if (sVar13 == 0) {
    pDVar7 = Symbol::getDeclaringDefinition(scope->thisSym);
    if ((pDVar7 != (DefinitionSymbol *)0x0) &&
       (resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                  ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> *)
                   &local_a8._M_value,&local_80,pDVar7->sourceLibrary), local_88 == '\x01')) {
LAB_00380b56:
      (__return_storage_ptr__->first).configRule = local_a8._M_value.first.configRule;
      *(undefined8 *)&__return_storage_ptr__->second = local_a8._24_8_;
      goto LAB_00380b72;
    }
  }
  else {
    for (lVar10 = 0; sVar13 * 8 != lVar10; lVar10 = lVar10 + 8) {
      resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> *)
                 &local_a8._M_value,&local_80,*(SourceLibrary **)((long)ppSVar11 + lVar10));
      if (local_88 == '\x01') goto LAB_00380b56;
    }
  }
  local_a8._M_value.first.definition = (Symbol *)0x0;
  local_a8._M_value.first.configRoot = (ConfigBlockSymbol *)0x0;
  *(undefined1 (*) [16])((long)&(__return_storage_ptr__->first).configRoot + 1) =
       (undefined1  [16])0x0;
LAB_00380b72:
  (__return_storage_ptr__->first).definition = local_a8._M_value.first.definition;
  (__return_storage_ptr__->first).configRoot = local_a8._M_value.first.configRoot;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Compilation::DefinitionLookupResult, bool> Compilation::resolveConfigRules(
    std::string_view lookupName, const Scope& scope, const ResolvedConfig* parentConfig,
    const ConfigRule* rule, const std::vector<Symbol*>& defList) const {

    const ConfigBlockSymbol::CellOverride* cellOverride = nullptr;
    std::span<const SourceLibrary* const> liblist;
    if (parentConfig) {
        SLANG_ASSERT(!rule);
        liblist = parentConfig->liblist;

        auto& conf = parentConfig->useConfig;
        auto& overrides = conf.getCellOverrides();
        if (auto overrideIt = overrides.find(lookupName); overrideIt != overrides.end()) {
            cellOverride = &overrideIt->second;
            rule = cellOverride->defaultRule;
        }
    }

    if (rule) {
        if (auto& id = rule->useCell; !id.name.empty())
            return resolveConfigRule(scope, *rule);

        rule->isUsed = true;
        if (rule->liblist)
            liblist = *rule->liblist;
    }

    auto findDefWithOverride = [&](const SourceLibrary& targetLib)
        -> std::optional<std::pair<Compilation::DefinitionLookupResult, bool>> {
        // If we have a cell override that specifically targets
        // this lib then we should just return that directly.
        if (cellOverride) {
            if (auto it = cellOverride->specificLibRules.find(&targetLib);
                it != cellOverride->specificLibRules.end()) {
                return resolveConfigRule(scope, *it->second);
            }
        }

        // Otherwise try to find the def in our list.
        if (auto def = findDefByLib(defList, targetLib)) {
            return std::pair<Compilation::DefinitionLookupResult, bool>{{def, nullptr, rule},
                                                                        false};
        }
        return std::nullopt;
    };

    if (!liblist.empty()) {
        // This search is O(n^2) but both lists should be small
        // (or even just one element each) in basically all cases.
        for (auto lib : liblist) {
            if (auto result = findDefWithOverride(*lib))
                return *result;
        }
    }
    else if (auto parentDef = scope.asSymbol().getDeclaringDefinition()) {
        // Fall back to picking based on the parent instance's library.
        if (auto result = findDefWithOverride(parentDef->sourceLibrary))
            return *result;
    }

    return {{}, false};
}